

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  undefined1 *puVar1;
  _func_int **pp_Var2;
  undefined1 *puVar3;
  void *pvVar4;
  
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = (pointer)0x96f878;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x96f968;
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity =
       0x96f8a0;
  *(undefined8 *)&this[-1].super_IfcTerminatorSymbol.field_0xb8 = 0x96f8c8;
  *(undefined8 *)&this[-1].field_0xc8 = 0x96f8f0;
  *(undefined8 *)&this[-1].field_0xd8 = 0x96f918;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x96f940;
  pp_Var2 = (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
            super_IfcAnnotationOccurrence.super_IfcStyledItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper;
  puVar1 = &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
            super_IfcAnnotationOccurrence.super_IfcStyledItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x10;
  if (pp_Var2 != (_func_int **)puVar1) {
    operator_delete(pp_Var2,*(long *)puVar1 + 1);
  }
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p = (pointer)0x96fd20;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20 = 0x96fd70;
  this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity =
       0x96fd48;
  puVar3 = *(undefined1 **)
            &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.field_0x90;
  puVar1 = &this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.field_0xa0;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  pvVar4 = *(void **)&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
                      super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x78;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&this[-1].super_IfcTerminatorSymbol.
                                     super_IfcAnnotationSymbolOccurrence.
                                     super_IfcAnnotationOccurrence.field_0x88 - (long)pvVar4);
  }
  operator_delete(&this[-1].super_IfcTerminatorSymbol.super_IfcAnnotationSymbolOccurrence.
                   super_IfcAnnotationOccurrence.super_IfcStyledItem.Name,0xf0);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}